

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

PClassActor * __thiscall USDFParser::CheckActorType(USDFParser *this,char *key)

{
  int typenum;
  char *name;
  PClassActor *cls;
  char *key_local;
  USDFParser *this_local;
  
  if ((this->super_UDMFParserBase).namespace_bits == 2) {
    typenum = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,key);
    this_local = (USDFParser *)GetStrifeType(typenum);
  }
  else if ((this->super_UDMFParserBase).namespace_bits == 1) {
    name = UDMFParserBase::CheckString(&this->super_UDMFParserBase,key);
    this_local = (USDFParser *)PClass::FindActor(name);
    if ((PClassActor *)this_local == (PClassActor *)0x0) {
      FScanner::ScriptMessage((FScanner *)this,"Unknown actor class \'%s\'",key);
      this_local = (USDFParser *)0x0;
    }
  }
  else {
    this_local = (USDFParser *)0x0;
  }
  return (PClassActor *)this_local;
}

Assistant:

PClassActor *CheckActorType(const char *key)
	{
		if (namespace_bits == St)
		{
			return GetStrifeType(CheckInt(key));
		}
		else if (namespace_bits == Zd)
		{
			PClassActor *cls = PClass::FindActor(CheckString(key));
			if (cls == NULL)
			{
				sc.ScriptMessage("Unknown actor class '%s'", key);
				return NULL;
			}
			return cls;
		}
		return NULL;
	}